

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm2dot.cpp
# Opt level: O0

fsm_def * fsm_from_file(fsm_def *__return_storage_ptr__,path *input_file_path)

{
  byte bVar1;
  bool bVar2;
  string_type *psVar3;
  ulong uVar4;
  ostream *poVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_368;
  char *local_348;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  char *local_2d8;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a8;
  locale local_288 [14];
  byte local_27a;
  allocator<char> local_279;
  undefined1 local_278 [6];
  bool in_transistions_chunk;
  string transistions_chunk;
  string line;
  istream local_228 [8];
  ifstream file;
  path *input_file_path_local;
  fsm_def *sm;
  
  fsm_def::fsm_def(__return_storage_ptr__);
  psVar3 = boost::filesystem::path::native_abi_cxx11_(input_file_path);
  std::ifstream::ifstream(local_228,psVar3,8);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Unable to open file: ");
    psVar3 = boost::filesystem::path::native_abi_cxx11_(input_file_path);
    poVar5 = std::operator<<(poVar5,(string *)psVar3);
    std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
    exit(1);
  }
  poVar5 = std::operator<<((ostream *)&std::cout,"Reading statemachine from: ");
  psVar3 = boost::filesystem::path::native_abi_cxx11_(input_file_path);
  poVar5 = std::operator<<(poVar5,(string *)psVar3);
  std::ostream::operator<<((ostream *)poVar5,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::string((string *)(transistions_chunk.field_2._M_local_buf + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_278,"",&local_279);
  std::allocator<char>::~allocator(&local_279);
  local_27a = 0;
  while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              (local_228,(string *)(transistions_chunk.field_2._M_local_buf + 8));
    std::locale::locale(local_288);
    boost::algorithm::trim<std::__cxx11::string>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               ((long)&transistions_chunk.field_2 + 8),local_288);
    std::locale::~locale(local_288);
    bVar2 = boost::algorithm::contains<std::__cxx11::string,char[18]>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&transistions_chunk.field_2 + 8),(char (*) [18])".transitions_from");
    if (bVar2) {
      if ((local_27a & 1) != 0) {
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::operator+(&local_2c8,"   ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
          std::operator+(&local_2a8,&local_2c8,"  ;");
          std::__cxx11::string::operator=((string *)local_278,(string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::__cxx11::string::~string((string *)&local_2c8);
          local_2d0._M_current = (char *)std::__cxx11::string::begin();
          local_2d8 = (char *)std::__cxx11::string::end();
          parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (__return_storage_ptr__,local_2d0,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_2d8);
        }
        std::__cxx11::string::clear();
      }
      local_27a = 1;
    }
    else {
      bVar2 = boost::algorithm::contains<std::__cxx11::string,char[17]>
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&transistions_chunk.field_2 + 8),(char (*) [17])".end_transitions");
      if (((bVar2) ||
          (bVar2 = boost::algorithm::contains<std::__cxx11::string,char[16]>
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              ((long)&transistions_chunk.field_2 + 8),
                              (char (*) [16])".otherwise_loop"), bVar2)) ||
         (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) != 0)) {
        local_27a = 0;
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::operator+(&local_2f8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((long)&transistions_chunk.field_2 + 8),"\n");
          std::__cxx11::string::append((string *)local_278);
          std::__cxx11::string::~string((string *)&local_2f8);
        }
        uVar4 = std::__cxx11::string::empty();
        if ((uVar4 & 1) == 0) {
          std::operator+(&local_338,"   ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_278);
          std::operator+(&local_318,&local_338,"  ;");
          std::__cxx11::string::operator=((string *)local_278,(string *)&local_318);
          std::__cxx11::string::~string((string *)&local_318);
          std::__cxx11::string::~string((string *)&local_338);
          local_340._M_current = (char *)std::__cxx11::string::begin();
          local_348 = (char *)std::__cxx11::string::end();
          parse_cpp_fsm_part<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
                    (__return_storage_ptr__,local_340,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )local_348);
        }
        std::__cxx11::string::clear();
      }
    }
    if (((local_27a & 1) != 0) && (uVar4 = std::__cxx11::string::empty(), (uVar4 & 1) == 0)) {
      std::operator+(&local_368,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&transistions_chunk.field_2 + 8),"\n");
      std::__cxx11::string::append((string *)local_278);
      std::__cxx11::string::~string((string *)&local_368);
    }
  }
  std::__cxx11::string::~string((string *)local_278);
  std::__cxx11::string::~string((string *)(transistions_chunk.field_2._M_local_buf + 8));
  std::ifstream::~ifstream(local_228);
  return __return_storage_ptr__;
}

Assistant:

fsm_def fsm_from_file(const boost::filesystem::path& input_file_path)
{
    namespace ba = boost::algorithm;
    fsm_def sm;
    std::ifstream file (input_file_path.native());
    if (file.is_open()) {
        std::cout << "Reading statemachine from: " << input_file_path.native() << std::endl;
        std::string line;
        std::string transistions_chunk ("");
        bool in_transistions_chunk = false;
        while (!file.eof()) {
            std::getline(file, line);
            boost::algorithm::trim(line);
            if (ba::contains(line, ".transitions_from")) {
                if (in_transistions_chunk) {
                    if (!transistions_chunk.empty()) {
                        transistions_chunk = "   " + transistions_chunk + "  ;";
//                        std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                        parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                    }
                    transistions_chunk.clear();
                }
                in_transistions_chunk = true;
            }
            else if ( ba::contains(line, ".end_transitions") ||
                 ba::contains(line, ".otherwise_loop") ||
                 line.empty()
               ) {
                in_transistions_chunk = false;
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
                if (!transistions_chunk.empty()) {
                    transistions_chunk = "   " + transistions_chunk + "  ;";
//                    std::cout << "--- parse transistions_chunk ---\n'" << transistions_chunk << "'" << std::endl;
                    parse_cpp_fsm_part(sm, transistions_chunk.begin(), transistions_chunk.end());
                }
                transistions_chunk.clear();
            }
            if (in_transistions_chunk) {
                if (!line.empty()) {
                    transistions_chunk.append(line + "\n");
                }
            }
        }
    }
    else {
        std::cout << "Unable to open file: " << input_file_path.native() << std::endl;
        exit(1);
    }

    return sm;
}